

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O0

string * __thiscall
cfd::api::HDWalletApi::CreateExtkeyFromParentPath
          (HDWalletApi *this,string *extkey,NetType net_type,ExtKeyType output_key_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_number_list)

{
  bool bVar1;
  undefined8 uVar2;
  reference puVar3;
  CfdException *this_00;
  NetType in_ECX;
  string *in_RDX;
  string *in_RDI;
  int in_R8D;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R9;
  uint32_t child_num;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  string errmsg_1;
  CfdException *pub_except;
  ExtPubkey pubkey;
  string errmsg;
  CfdException *except;
  ExtPrivkey privkey;
  uint32_t version;
  uint32_t check_version;
  string *result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff9b8;
  ExtPrivkey *in_stack_fffffffffffff9c0;
  allocator *paVar4;
  string *in_stack_fffffffffffff9d0;
  CfdError in_stack_fffffffffffff9dc;
  CfdException *in_stack_fffffffffffff9e0;
  allocator local_589;
  string local_588 [32];
  CfdSourceLocation local_568;
  ExtPubkey local_550;
  string local_4e0;
  undefined1 local_4ba;
  allocator local_4b9;
  string local_4b8 [32];
  CfdSourceLocation local_498;
  uint local_47c;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_478;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_470;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_468;
  undefined1 local_45a;
  allocator local_459;
  string local_458 [32];
  CfdSourceLocation local_438 [5];
  ExtPubkey local_3b0;
  ExtPubkey local_340;
  ExtPubkey local_2d0;
  string local_260;
  ExtPrivkey local_240;
  string local_1c8 [2];
  ExtPrivkey local_178;
  ExtPrivkey local_100;
  undefined1 local_82;
  allocator local_81;
  string local_80 [48];
  CfdSourceLocation local_50;
  CfdError local_34;
  CfdError local_30;
  byte local_29;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  int local_20;
  NetType local_1c;
  string *local_18;
  
  local_29 = 0;
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(local_28);
  if (bVar1) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_hdwallet.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x92;
    local_50.funcname = "CreateExtkeyFromParentPath";
    core::logger::warn<>(&local_50,"child_number_list empty.");
    local_82 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"child_number_list empty.",&local_81);
    core::CfdException::CfdException
              (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d0);
    local_82 = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::ExtPrivkey::ExtPrivkey(&local_100);
  core::ExtPrivkey::ExtPrivkey(&local_178,local_18);
  core::ExtPrivkey::operator=(&local_100,&local_178);
  core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffff9c0);
  bVar1 = core::ExtPrivkey::IsValid(&local_100);
  if (bVar1) {
    if (local_20 == 0) {
      core::ExtPrivkey::DerivePrivkey(&local_240,&local_100,local_28);
      core::ExtPrivkey::ToString_abi_cxx11_(local_1c8,&local_240);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)local_1c8);
      std::__cxx11::string::~string((string *)local_1c8);
      core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffff9c0);
    }
    else {
      core::ExtPrivkey::DerivePubkey(&local_2d0,&local_100,local_28);
      core::ExtPubkey::ToString_abi_cxx11_(&local_260,&local_2d0);
      std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff9c0);
    }
    local_34 = core::ExtPrivkey::GetVersion(&local_100);
    local_30 = GetExtkeyVersion(kExtPrivkey,local_1c);
  }
  else {
    core::ExtPubkey::ExtPubkey(&local_340);
    core::ExtPubkey::ExtPubkey(&local_3b0,local_18);
    core::ExtPubkey::operator=(&local_340,&local_3b0);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff9c0);
    if (local_20 == 0) {
      local_438[0].filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_hdwallet.cpp"
                   ,0x2f);
      local_438[0].filename = local_438[0].filename + 1;
      local_438[0].line = 0xbc;
      local_438[0].funcname = "CreateExtkeyFromParentPath";
      core::logger::warn<>(local_438,"Illegal output_key_type. Cannot create privkey from pubkey.");
      local_45a = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_458,"Illegal output_key_type. Cannot create privkey from pubkey.",&local_459)
      ;
      core::CfdException::CfdException
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d0);
      local_45a = 0;
      __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    local_468 = local_28;
    local_470._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (in_stack_fffffffffffff9b8);
    local_478._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           (in_stack_fffffffffffff9b8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_470,&local_478);
      if (!bVar1) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_470);
      local_47c = *puVar3;
      if ((local_47c & 0x80000000) != 0) {
        local_498.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_hdwallet.cpp"
                     ,0x2f);
        local_498.filename = local_498.filename + 1;
        local_498.line = 0xc6;
        local_498.funcname = "CreateExtkeyFromParentPath";
        core::logger::warn<>(&local_498,"Illegal child_number. Hardened is privkey only.");
        local_4ba = 1;
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_4b8,"Illegal child_number. Hardened is privkey only.",&local_4b9);
        core::CfdException::CfdException
                  (this_00,in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d0);
        local_4ba = 0;
        __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_470);
    }
    core::ExtPubkey::DerivePubkey(&local_550,&local_340,local_28);
    core::ExtPubkey::ToString_abi_cxx11_(&local_4e0,&local_550);
    in_stack_fffffffffffff9d0 = &local_4e0;
    std::__cxx11::string::operator=((string *)in_RDI,(string *)in_stack_fffffffffffff9d0);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffff9d0);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff9c0);
    in_stack_fffffffffffff9dc = core::ExtPubkey::GetVersion(&local_340);
    local_34 = in_stack_fffffffffffff9dc;
    local_30 = GetExtkeyVersion(kExtPubkey,local_1c);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff9c0);
  }
  if (local_34 != local_30) {
    local_568.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_hdwallet.cpp"
                 ,0x2f);
    local_568.filename = local_568.filename + 1;
    local_568.line = 0xd2;
    local_568.funcname = "CreateExtkeyFromParentPath";
    core::logger::warn<unsigned_int&>
              (&local_568,"Version unmatch. key version: {}",(uint *)&local_34);
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_589;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_588,"extkey networkType unmatch.",paVar4);
    core::CfdException::CfdException
              (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d0);
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_29 = 1;
  core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffff9c0);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string HDWalletApi::CreateExtkeyFromParentPath(
    const std::string& extkey, NetType net_type, ExtKeyType output_key_type,
    const std::vector<uint32_t>& child_number_list) const {
  std::string result;
  uint32_t check_version;
  uint32_t version;

  if (child_number_list.empty()) {
    warn(CFD_LOG_SOURCE, "child_number_list empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "child_number_list empty.");
  }

  ExtPrivkey privkey;
  try {
    privkey = ExtPrivkey(extkey);
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if ((errmsg.find(kBase58Error) == std::string::npos) &&
        (errmsg.find(kKeyTypeError) == std::string::npos)) {
      throw except;
    }
  }

  if (privkey.IsValid()) {
    if (output_key_type == ExtKeyType::kExtPrivkey) {
      result = privkey.DerivePrivkey(child_number_list).ToString();
    } else {
      result = privkey.DerivePubkey(child_number_list).ToString();
    }
    version = privkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);

  } else {
    ExtPubkey pubkey;
    try {
      pubkey = ExtPubkey(extkey);
    } catch (const CfdException& pub_except) {
      std::string errmsg(pub_except.what());
      if (errmsg.find(kBase58Error) != std::string::npos) {
        warn(CFD_LOG_SOURCE, "Illegal extkey. base58 decode error.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal extkey. base58 decode error.");
      }
      throw pub_except;
    }

    if (output_key_type == ExtKeyType::kExtPrivkey) {
      warn(
          CFD_LOG_SOURCE,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
    }
    for (const uint32_t child_num : child_number_list) {
      // libwallyでもエラー検知されるが、エラーを把握しやすくするため確認
      if ((child_num & ExtPrivkey::kHardenedKey) != 0) {
        warn(
            CFD_LOG_SOURCE, "Illegal child_number. Hardened is privkey only.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal child_number. Hardened is privkey only.");
      }
    }
    result = pubkey.DerivePubkey(child_number_list).ToString();
    version = pubkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPubkey, net_type);
  }

  if (version != check_version) {
    warn(CFD_LOG_SOURCE, "Version unmatch. key version: {}", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return result;
}